

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  headers;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_04;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  row_05;
  allocator local_84d;
  allocator local_84c;
  allocator local_84b;
  allocator local_84a;
  allocator local_849;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  string local_828 [32];
  string local_808 [32];
  string local_7e8 [32];
  string local_7c8 [32];
  string local_7a8;
  string local_788;
  ConsoleTable table;
  
  std::__cxx11::string::string((string *)&local_848,"Country",&local_849);
  std::__cxx11::string::string(local_828,"Capital",&local_84a);
  std::__cxx11::string::string(local_808,"Population",&local_84b);
  std::__cxx11::string::string(local_7e8,"Area",&local_84c);
  std::__cxx11::string::string(local_7c8,"Currency",&local_84d);
  headers._M_len = 5;
  headers._M_array = &local_848;
  ConsoleTable::ConsoleTable(&table,headers);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_848._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  ConsoleTable::setPadding(&table,2);
  ConsoleTable::setStyle(&table,0);
  std::__cxx11::string::string((string *)&local_848,"Germany",&local_849);
  std::__cxx11::string::string(local_828,"Berlin",&local_84a);
  std::__cxx11::string::string(local_808,"82,800,000",&local_84b);
  std::__cxx11::string::string(local_7e8,"357,168 km2",&local_84c);
  std::__cxx11::string::string(local_7c8,"Euro",&local_84d);
  row._M_len = 5;
  row._M_array = &local_848;
  ConsoleTable::operator+=(&table,row);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_848._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_848,"France",&local_849);
  std::__cxx11::string::string(local_828,"Paris",&local_84a);
  std::__cxx11::string::string(local_808,"67,201,000",&local_84b);
  std::__cxx11::string::string(local_7e8,"640,679 km2 ",&local_84c);
  std::__cxx11::string::string(local_7c8,"Euro",&local_84d);
  row_00._M_len = 5;
  row_00._M_array = &local_848;
  ConsoleTable::operator+=(&table,row_00);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_848._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_848,"South Korea",&local_849);
  std::__cxx11::string::string(local_828,"Seoul",&local_84a);
  std::__cxx11::string::string(local_808,"51,446,201",&local_84b);
  std::__cxx11::string::string(local_7e8,"100,210 km2 ",&local_84c);
  std::__cxx11::string::string(local_7c8,"South Korean Won",&local_84d);
  row_01._M_len = 5;
  row_01._M_array = &local_848;
  ConsoleTable::operator+=(&table,row_01);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_848._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_848,"Australia",&local_849);
  std::__cxx11::string::string(local_828,"Canberra",&local_84a);
  std::__cxx11::string::string(local_808,"24,877,800",&local_84b);
  std::__cxx11::string::string(local_7e8,"7,692,024 km2",&local_84c);
  std::__cxx11::string::string(local_7c8,"Australian Dollar",&local_84d);
  row_02._M_len = 5;
  row_02._M_array = &local_848;
  ConsoleTable::operator+=(&table,row_02);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_848._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_848,"China",&local_849);
  std::__cxx11::string::string(local_828,"Beijing",&local_84a);
  std::__cxx11::string::string(local_808,"1,403,500,365",&local_84b);
  std::__cxx11::string::string(local_7e8,"9,596,961 km2",&local_84c);
  std::__cxx11::string::string(local_7c8,"Yuan",&local_84d);
  row_03._M_len = 5;
  row_03._M_array = &local_848;
  ConsoleTable::operator+=(&table,row_03);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_848._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_848,"Iceland",&local_849);
  std::__cxx11::string::string(local_828,"Reykjavik",&local_84a);
  std::__cxx11::string::string(local_808,"348,580",&local_84b);
  std::__cxx11::string::string(local_7e8,"102,775 km2",&local_84c);
  std::__cxx11::string::string(local_7c8,"Icelandic Krona",&local_84d);
  row_04._M_len = 5;
  row_04._M_array = &local_848;
  ConsoleTable::operator+=(&table,row_04);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_848._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_848,"Netherlands",&local_849);
  std::__cxx11::string::string(local_828,"Amsterdam",&local_84a);
  std::__cxx11::string::string(local_808,"17,200,671",&local_84b);
  std::__cxx11::string::string(local_7e8,"41,543 km2",&local_84c);
  std::__cxx11::string::string(local_7c8,"Euro",&local_84d);
  row_05._M_len = 5;
  row_05._M_array = &local_848;
  ConsoleTable::operator+=(&table,row_05);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_848._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string((string *)&local_788,"NEW ENTRY",(allocator *)&local_848);
  ConsoleTable::updateRow(&table,3,1,&local_788);
  std::__cxx11::string::~string((string *)&local_788);
  std::__cxx11::string::string((string *)&local_7a8,"NEW HEADER",(allocator *)&local_848);
  ConsoleTable::updateHeader(&table,2,&local_7a8);
  std::__cxx11::string::~string((string *)&local_7a8);
  ConsoleTable::operator-=(&table,2);
  ConsoleTable::operator-=(&table,1);
  ConsoleTable::operator-=(&table,0);
  ConsoleTable::sort(&table,true);
  operator<<((ostream *)&std::cout,&table);
  ConsoleTable::~ConsoleTable(&table);
  return 0;
}

Assistant:

int main() {

    ConsoleTable table{"Country", "Capital", "Population", "Area", "Currency"};

    table.setPadding(2);
    table.setStyle(0);

    table += {"Germany", "Berlin", "82,800,000", "357,168 km2", "Euro"};
    table += {"France", "Paris", "67,201,000", "640,679 km2 ", "Euro"};
    table += {"South Korea", "Seoul", "51,446,201", "100,210 km2 ", "South Korean Won"};
    table += {"Australia", "Canberra", "24,877,800", "7,692,024 km2", "Australian Dollar"};
    table += {"China", "Beijing", "1,403,500,365", "9,596,961 km2", "Yuan"};
    table += {"Iceland", "Reykjavik", "348,580", "102,775 km2", "Icelandic Krona"};
    table += {"Netherlands", "Amsterdam", "17,200,671", "41,543 km2", "Euro"};

    table.updateRow(3, 1, "NEW ENTRY");
    table.updateHeader(2, "NEW HEADER");

    table -= 2;
    table -= 1;
    table -= 0;
    table.sort(true);

    std::cout << table;

    return 0;
}